

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O3

void testPosixIO(char *inFile,char *outFile,vector<char,_std::allocator<char>_> *inBuffer)

{
  int __fd;
  int __fd_00;
  ulong uVar1;
  size_t sVar2;
  ulong __nbytes;
  size_t bytesLeft;
  
  __fd = open(inFile,0);
  if (__fd < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Can\'t open input file: ",0x17);
    if (inFile == (char *)0x0) goto LAB_00105afe;
    sVar2 = strlen(inFile);
    outFile = inFile;
  }
  else {
    __fd_00 = open(outFile,0x41,0x1b6);
    if (-1 < __fd_00) {
      uVar1 = lseek(__fd,0,2);
      lseek(__fd,0,0);
      if (uVar1 != 0) {
        __nbytes = (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start;
        do {
          if (uVar1 < __nbytes) {
            __nbytes = uVar1;
          }
          read(__fd,(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start,__nbytes);
          write(__fd_00,(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start,__nbytes);
          uVar1 = uVar1 - __nbytes;
        } while (uVar1 != 0);
      }
      close(__fd_00);
      close(__fd);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Can\'t open output file: ",0x18);
    if (outFile == (char *)0x0) {
LAB_00105afe:
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c1c8);
      goto LAB_00105b15;
    }
    sVar2 = strlen(outFile);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,outFile,sVar2);
LAB_00105b15:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  return;
}

Assistant:

void testPosixIO(const char* inFile, const char* outFile, std::vector<char>& inBuffer)
{
    int in = ::open(inFile, O_RDONLY | O_BINARY);
    if (in < 0)
    {
        std::cout << "Can't open input file: " << inFile << std::endl;
        return;
    }

    int out = ::open(outFile, O_CREAT | O_WRONLY | O_BINARY, 0666);
    if (out < 0)
    {
        std::cout << "Can't open output file: " << outFile << std::endl;
        return;
    }

    size_t inFileSize = ::lseek(in, 0, SEEK_END);
    ::lseek(in, 0, SEEK_SET);

    for (size_t bytesLeft = inFileSize, chunk = inBuffer.size(); bytesLeft > 0; bytesLeft -= chunk)
    {
        if (bytesLeft < chunk)
        {
            chunk = bytesLeft;
        }

        ::read(in, &inBuffer[0], chunk);
        ::write(out, &inBuffer[0], chunk);
    }

    ::close(out);
    ::close(in);
}